

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O2

string_view gmlc::utilities::string_viewOps::trim(string_view input,string_view trimCharacters)

{
  size_type __pos;
  size_type sVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  string_view input_local;
  
  input_local._M_str = input._M_str;
  input_local._M_len = input._M_len;
  __pos = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                    (&input_local,trimCharacters._M_str,0,trimCharacters._M_len);
  if (__pos == 0xffffffffffffffff) {
    bVar2 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
  }
  else {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      (&input_local,trimCharacters._M_str,0xffffffffffffffff,trimCharacters._M_len);
    bVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&input_local,__pos,
                       (sVar1 - __pos) + 1);
  }
  sVar3._M_len = bVar2._M_len;
  sVar3._M_str = bVar2._M_str;
  return sVar3;
}

Assistant:

std::string_view trim(std::string_view input, std::string_view trimCharacters)
{
    const auto strStart = input.find_first_not_of(trimCharacters);
    if (strStart == std::string::npos) {
        return {};  // no content
    }

    const auto strEnd = input.find_last_not_of(trimCharacters);

    return input.substr(strStart, strEnd - strStart + 1);
}